

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *pNtkAig,Abc_Obj_t *pBox)

{
  Abc_Ntk_t *pNtk;
  long *plVar1;
  ulong uVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  
  if ((*(uint *)&pBox->field_0x14 & 0xf) != 10 && (*(uint *)&pBox->field_0x14 & 0xe) != 8) {
    __assert_fail("Abc_ObjIsBox(pBox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                  ,0x174,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pNtk = (Abc_Ntk_t *)(pBox->field_5).pData;
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    if (pNtk->nObjCounts[8] == 0) {
      pAVar5 = pBox->pNext;
      Abc_NtkCleanCopy(pNtk);
      pVVar3 = pNtk->vPis;
      if (0 < pVVar3->nSize) {
        uVar2 = 0;
        do {
          if (pAVar5 == (Abc_Obj_t *)0x0) {
            uVar4 = 0;
          }
          else {
            uVar4 = (ulong)((*(uint *)((long)&pAVar5->pNtk + (uVar2 >> 5 & 0x7ffffff) * 4) >>
                             ((uint)uVar2 & 0x1f) & 1) != 0);
          }
          plVar1 = (long *)pVVar3->pArray[uVar2];
          uVar4 = uVar4 ^ *(ulong *)((long)pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[uVar2]]
                                    + 0x40);
          plVar1[8] = uVar4;
          *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                              (long)*(int *)plVar1[6] * 8) + 0x40) = uVar4;
          uVar2 = uVar2 + 1;
          pVVar3 = pNtk->vPis;
        } while ((long)uVar2 < (long)pVVar3->nSize);
      }
      pVVar3 = pNtk->vPos;
      if (0 < pVVar3->nSize) {
        lVar6 = 0;
        do {
          plVar1 = (long *)pVVar3->pArray[lVar6];
          pAVar5 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
          if (pAVar5->pNtk->ntkType == ABC_NTK_NETLIST) {
            pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          }
          Abc_NodeStrashUsingNetwork_rec(pNtkAig,pAVar5);
          *(undefined8 *)((long)pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar6]] + 0x40) =
               *(undefined8 *)
                (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8) +
                0x40);
          lVar6 = lVar6 + 1;
          pVVar3 = pNtk->vPos;
        } while (lVar6 < pVVar3->nSize);
      }
      return;
    }
    __assert_fail("Abc_NtkLatchNum(pNtkGate) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                  ,0x178,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  __assert_fail("Abc_NtkIsNetlist(pNtkGate)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcLib.c"
                ,0x177,"void Abc_NodeStrashUsingNetwork(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_NodeStrashUsingNetwork( Abc_Ntk_t * pNtkAig, Abc_Obj_t * pBox )
{ 
    Abc_Ntk_t * pNtkGate;
    Abc_Obj_t * pObj;
    unsigned * pPolarity;
    int i, fCompl;
    assert( Abc_ObjIsBox(pBox) );
    pNtkGate = (Abc_Ntk_t *)pBox->pData;
    pPolarity = (unsigned *)pBox->pNext;
    assert( Abc_NtkIsNetlist(pNtkGate) );
    assert( Abc_NtkLatchNum(pNtkGate) == 0 );
    Abc_NtkCleanCopy( pNtkGate );
    // set the PI values
    Abc_NtkForEachPi( pNtkGate, pObj, i )
    {
        fCompl = (pPolarity && Abc_InfoHasBit(pPolarity, i));
        pObj->pCopy = Abc_ObjNotCond( Abc_ObjFanin(pBox,i)->pCopy, fCompl );
        Abc_ObjFanout0(pObj)->pCopy = pObj->pCopy;
    }
    // build recursively and set the PO values
    Abc_NtkForEachPo( pNtkGate, pObj, i )
    {
        Abc_NodeStrashUsingNetwork_rec( pNtkAig, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)) );
        Abc_ObjFanout(pBox,i)->pCopy = Abc_ObjFanin0(pObj)->pCopy;
    }
//printf( "processing %d\n", pBox->Id );
}